

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize-async.c++
# Opt level: O0

Maybe<int> __thiscall capnp::getSendBufferSize(capnp *this,AsyncIoStream *stream)

{
  NullableValue<kj::Exception> *other;
  Exception *pEVar1;
  Exception *this_00;
  anon_class_16_2_463ae2df *in_RDX;
  Exception *exception;
  undefined1 local_360 [424];
  undefined1 local_1b8 [8];
  NullableValue<kj::Exception> _exception467;
  int bufSize;
  AsyncIoStream *stream_local;
  
  _exception467.field_1._396_4_ = 0;
  local_360._8_8_ = (long)&_exception467.field_1 + 0x18c;
  local_360._0_8_ = stream;
  kj::runCatchingExceptions<capnp::getSendBufferSize(kj::AsyncIoStream&)::__0>
            ((Maybe<kj::Exception> *)(local_360 + 0x10),(kj *)local_360,in_RDX);
  other = kj::_::readMaybe<kj::Exception>((Maybe<kj::Exception> *)(local_360 + 0x10));
  kj::_::NullableValue<kj::Exception>::NullableValue
            ((NullableValue<kj::Exception> *)local_1b8,other);
  kj::Maybe<kj::Exception>::~Maybe((Maybe<kj::Exception> *)(local_360 + 0x10));
  pEVar1 = kj::_::NullableValue::operator_cast_to_Exception_((NullableValue *)local_1b8);
  if (pEVar1 != (Exception *)0x0) {
    this_00 = kj::_::NullableValue<kj::Exception>::operator*
                        ((NullableValue<kj::Exception> *)local_1b8);
    kj::Exception::getType(this_00);
    kj::Maybe<int>::Maybe((Maybe<int> *)this);
  }
  kj::_::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)local_1b8);
  if (pEVar1 == (Exception *)0x0) {
    kj::Maybe<int>::Maybe((Maybe<int> *)this,(int *)((long)&_exception467.field_1 + 0x18c));
  }
  return (Maybe<int>)(NullableValue<int>)this;
}

Assistant:

kj::Maybe<int> getSendBufferSize(kj::AsyncIoStream& stream) {
  // TODO(perf): It might be nice to have a tryGetsockopt() that doesn't require catching
  //   exceptions?
  int bufSize = 0;
  KJ_IF_SOME(exception, kj::runCatchingExceptions([&]() {
    uint len = sizeof(int);
    stream.getsockopt(SOL_SOCKET, SO_SNDBUF, &bufSize, &len);
    KJ_ASSERT(len == sizeof(bufSize)) { break; }
  })) {
    if (exception.getType() != kj::Exception::Type::UNIMPLEMENTED) {
      // TODO(someday): Figure out why getting SO_SNDBUF sometimes throws EINVAL. I suspect it
      //   happens when the remote side has closed their read end, meaning we no longer have
      //   a send buffer, but I don't know what is the best way to verify that that was actually
      //   the reason. I'd prefer not to ignore EINVAL errors in general.

      // kj::throwRecoverableException(kj::mv(exception));
    }
    return kj::none;
  }
  return bufSize;
}